

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

bool __thiscall EOPlus::Context::TriggerRule(Context *this,string *rule)

{
  bool bVar1;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)rule);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GabrielLins64[P]custom-eoserv/tu/../src/eoplus/context.cpp:165:34)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GabrielLins64[P]custom-eoserv/tu/../src/eoplus/context.cpp:165:34)>
             ::_M_manager;
  bVar1 = TriggerRule(this,&local_30,
                      (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                       *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool Context::TriggerRule(std::string rule)
	{
		return this->TriggerRule(rule, [](const std::deque<util::variant>&) { return true; });
	}